

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_value.h
# Opt level: O1

void __thiscall
polyscope::PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue
          (PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *this)

{
  pointer pcVar1;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar2;
  mapped_type *pmVar3;
  
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&detail::persistentCache_glmvec3,&this->name);
  pmVar3->field_2 = (this->value).field_2;
  aVar2 = (this->value).field_1;
  pmVar3->field_0 = (this->value).field_0;
  pmVar3->field_1 = aVar2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~PersistentValue() { set(value); }